

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.h
# Opt level: O0

void __thiscall mkvmuxer::Projection::Projection(Projection *this)

{
  Projection *this_local;
  
  this->type_ = kRectangular;
  this->pose_yaw_ = 0.0;
  this->pose_pitch_ = 0.0;
  this->pose_roll_ = 0.0;
  this->private_data_ = (uint8_t *)0x0;
  this->private_data_length_ = 0;
  return;
}

Assistant:

Projection()
      : type_(kRectangular),
        pose_yaw_(0.0),
        pose_pitch_(0.0),
        pose_roll_(0.0),
        private_data_(NULL),
        private_data_length_(0) {}